

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_tests.cpp
# Opt level: O2

void __thiscall validation_tests::test_assumeutxo::test_method(test_assumeutxo *this)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  optional<AssumeutxoData> *poVar4;
  AssumeutxoData *pAVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  uint64_t *puVar7;
  string *psVar8;
  pointer piVar9;
  long in_FS_OFFSET;
  byte bVar10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  initializer_list<int> __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  check_type cVar11;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  vector<int,_std::allocator<int>_> bad_heights;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> params;
  string local_158;
  AssumeutxoData out110_2;
  AssumeutxoData out110;
  optional<AssumeutxoData> out;
  
  bVar10 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  CreateChainParams((ArgsManager *)&params,
                    (ChainType)
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.args);
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._0_8_ = 0x6400000000;
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._8_8_ = 0x730000006f;
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._16_8_ = 0xd3000000d1;
  __l._M_len = 6;
  __l._M_array = (iterator)&out;
  std::vector<int,_std::allocator<int>_>::vector(&bad_heights,__l,(allocator_type *)&out110);
  for (piVar9 = bad_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar9 != bad_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar9 = piVar9 + 1) {
    CChainParams::AssumeutxoForHeight
              (&out,(CChainParams *)
                    params._M_t.
                    super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                    .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl,*piVar9);
    local_188 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_180 = "";
    local_198 = &boost::unit_test::basic_cstring<char_const>::null;
    local_190 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar11 = 0x5fad5f;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x8d;
    file.m_begin = (iterator)&local_188;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_198,msg);
    out110_2.height =
         CONCAT31(out110_2.height._1_3_,
                  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
                  super__Optional_payload_base<AssumeutxoData>._M_engaged) ^ 1;
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[4]
         = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[5]
         = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[6]
         = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[7]
         = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[8]
         = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[9]
         = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [10] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0xb] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0xc] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0xd] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0xe] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0xf] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0x10] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0x11] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0x12] = '\0';
    out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0x13] = '\0';
    local_158._M_dataplus._M_p = "!out";
    local_158._M_string_length = (long)"!out" + 4;
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[4] =
         '\0';
    out110._0_8_ = &PTR__lazy_ostream_0113a070;
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
    _12_8_ = boost::unit_test::lazy_ostream::inst;
    out110.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems.
    _20_8_ = &local_158;
    local_1a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_1a0 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&out110_2,(lazy_ostream *)&out110,1,0,WARN,_cVar11,
               (size_t)&local_1a8,0x8d);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)out110_2.hash_serialized.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.
                      m_data._M_elems + 0xc));
  }
  CChainParams::AssumeutxoForHeight
            (&out,(CChainParams *)
                  params._M_t.
                  super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                  .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl,0x6e);
  poVar4 = &out;
  pAVar5 = &out110;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined8 *)
             &(poVar4->super__Optional_base<AssumeutxoData,_true,_true>)._M_payload.
              super__Optional_payload_base<AssumeutxoData>._M_payload;
    pAVar5->height = (int)uVar1;
    (pAVar5->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0] = (char)((ulong)uVar1 >> 0x20);
    (pAVar5->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [1] = (char)((ulong)uVar1 >> 0x28);
    (pAVar5->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [2] = (char)((ulong)uVar1 >> 0x30);
    (pAVar5->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [3] = (char)((ulong)uVar1 >> 0x38);
    poVar4 = (optional<AssumeutxoData> *)((long)poVar4 + (ulong)bVar10 * -0x10 + 8);
    pAVar5 = (AssumeutxoData *)((long)pAVar5 + (ulong)bVar10 * -0x10 + 8);
  }
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0x91;
  file_00.m_begin = (iterator)&local_1b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1c8,
             msg_00);
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._8_8_ =
       out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
       super__Optional_payload_base<AssumeutxoData>._M_payload._8_8_ & 0xffffffffffffff00;
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._0_8_ = &PTR__lazy_ostream_01139f30;
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_1d0 = "";
  base_blob<256u>::ToString_abi_cxx11_
            ((string *)&out110_2,(base_blob<256u> *)&out110.hash_serialized);
  pvVar6 = (iterator)0x2;
  pAVar5 = &out110_2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (&out,&local_1d8,0x91,1,2,pAVar5,"out110.hash_serialized.ToString()",
             "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1",
             "\"6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1\"");
  std::__cxx11::string::~string((string *)&out110_2);
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pAVar5;
  msg_01.m_begin = pvVar6;
  file_01.m_end = (iterator)0x92;
  file_01.m_begin = (iterator)&local_1e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1f8,
             msg_01);
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._8_8_ =
       out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
       super__Optional_payload_base<AssumeutxoData>._M_payload._8_8_ & 0xffffffffffffff00;
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._0_8_ = &PTR__lazy_ostream_01139f30;
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_200 = "";
  puVar7 = &out110.m_chain_tx_count;
  out110_2.height = 0x6f;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&out,&local_208,0x92,1,2,puVar7,"out110.m_chain_tx_count",&out110_2,"111U");
  local_158._M_dataplus._M_p = (pointer)0x98c0aec0ab50425c;
  local_158._M_string_length = 0x4105647a3c4fd9f2;
  local_158.field_2._M_allocated_capacity = 0x7ee134edceeeeaaa;
  local_158.field_2._8_8_ = (__pthread_internal_list *)0x696e92821f65549c;
  FindFirst<AssumeutxoData,CChainParams::AssumeutxoForBlockhash(uint256_const&)const::_lambda(auto:1_const&)_1_>
            (&out,(vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *)
                  ((long)params._M_t.
                         super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                         .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x308),
             (uint256 *)&local_158);
  poVar4 = &out;
  pAVar5 = &out110_2;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined8 *)
             &(poVar4->super__Optional_base<AssumeutxoData,_true,_true>)._M_payload.
              super__Optional_payload_base<AssumeutxoData>._M_payload;
    pAVar5->height = (int)uVar1;
    (pAVar5->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [0] = (char)((ulong)uVar1 >> 0x20);
    (pAVar5->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [1] = (char)((ulong)uVar1 >> 0x28);
    (pAVar5->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [2] = (char)((ulong)uVar1 >> 0x30);
    (pAVar5->hash_serialized).super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems
    [3] = (char)((ulong)uVar1 >> 0x38);
    poVar4 = (optional<AssumeutxoData> *)((long)poVar4 + (ulong)bVar10 * -0x10 + 8);
    pAVar5 = (AssumeutxoData *)((long)pAVar5 + (ulong)bVar10 * -0x10 + 8);
  }
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)puVar7;
  msg_02.m_begin = pvVar6;
  file_02.m_end = (iterator)0x95;
  file_02.m_begin = (iterator)&local_218;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_228,
             msg_02);
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._8_8_ =
       out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
       super__Optional_payload_base<AssumeutxoData>._M_payload._8_8_ & 0xffffffffffffff00;
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._0_8_ = &PTR__lazy_ostream_01139f30;
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_230 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_158,(base_blob<256u> *)&out110_2.hash_serialized);
  pvVar6 = (iterator)0x2;
  psVar8 = &local_158;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (&out,&local_238,0x95,1,2,psVar8,"out110_2.hash_serialized.ToString()",
             "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1",
             "\"6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1\"");
  std::__cxx11::string::~string((string *)&local_158);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)psVar8;
  msg_03.m_begin = pvVar6;
  file_03.m_end = (iterator)0x96;
  file_03.m_begin = (iterator)&local_248;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_258,
             msg_03);
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._8_8_ =
       out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
       super__Optional_payload_base<AssumeutxoData>._M_payload._8_8_ & 0xffffffffffffff00;
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._0_8_ = &PTR__lazy_ostream_01139f30;
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  out.super__Optional_base<AssumeutxoData,_true,_true>._M_payload.
  super__Optional_payload_base<AssumeutxoData>._M_payload._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_260 = "";
  local_158._M_dataplus._M_p._0_4_ = 0x6f;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&out,&local_268,0x96,1,2,&out110_2.m_chain_tx_count,"out110_2.m_chain_tx_count",
             &local_158,"111U");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&bad_heights.super__Vector_base<int,_std::allocator<int>_>);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            (&params);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_assumeutxo)
{
    const auto params = CreateChainParams(*m_node.args, ChainType::REGTEST);

    // These heights don't have assumeutxo configurations associated, per the contents
    // of kernel/chainparams.cpp.
    std::vector<int> bad_heights{0, 100, 111, 115, 209, 211};

    for (auto empty : bad_heights) {
        const auto out = params->AssumeutxoForHeight(empty);
        BOOST_CHECK(!out);
    }

    const auto out110 = *params->AssumeutxoForHeight(110);
    BOOST_CHECK_EQUAL(out110.hash_serialized.ToString(), "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1");
    BOOST_CHECK_EQUAL(out110.m_chain_tx_count, 111U);

    const auto out110_2 = *params->AssumeutxoForBlockhash(uint256{"696e92821f65549c7ee134edceeeeaaa4105647a3c4fd9f298c0aec0ab50425c"});
    BOOST_CHECK_EQUAL(out110_2.hash_serialized.ToString(), "6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1");
    BOOST_CHECK_EQUAL(out110_2.m_chain_tx_count, 111U);
}